

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_fdset(CURLM *m,fd_set *read_fd_set,fd_set *write_fd_set,fd_set *exc_fd_set,
                          int *max_fd)

{
  byte bVar1;
  _Bool _Var2;
  CURLMcode CVar3;
  Curl_easy *data;
  int iVar4;
  ulong uVar5;
  uint mid;
  int local_64;
  int *local_60;
  uint_bset *local_58;
  easy_pollset ps;
  
  local_64 = -1;
  CVar3 = CURLM_BAD_HANDLE;
  if ((m != (CURLM *)0x0) && (*m == 0xbab1e)) {
    if ((*(byte *)((long)m + 0x271) & 4) == 0) {
      local_58 = (uint_bset *)((long)m + 0x28);
      local_60 = max_fd;
      _Var2 = Curl_uint_bset_first(local_58,&mid);
      if (_Var2) {
        iVar4 = -1;
        do {
          data = Curl_multi_get_easy((Curl_multi *)m,mid);
          if (data != (Curl_easy *)0x0) {
            Curl_multi_getsock(data,&ps,"curl_multi_fdset");
            local_64 = iVar4;
            for (uVar5 = 0; iVar4 = local_64, ps.num != uVar5; uVar5 = uVar5 + 1) {
              iVar4 = ps.sockets[uVar5];
              if (iVar4 < 0x400) {
                bVar1 = ps.actions[uVar5];
                if ((bVar1 & 1) != 0) {
                  read_fd_set->fds_bits[iVar4 / 0x40] =
                       read_fd_set->fds_bits[iVar4 / 0x40] | 1L << ((byte)iVar4 & 0x3f);
                }
                if ((bVar1 & 2) != 0) {
                  write_fd_set->fds_bits[iVar4 / 0x40] =
                       write_fd_set->fds_bits[iVar4 / 0x40] | 1L << ((byte)iVar4 & 0x3f);
                }
                if (local_64 < iVar4) {
                  local_64 = iVar4;
                }
              }
            }
          }
          _Var2 = Curl_uint_bset_next(local_58,mid,&mid);
        } while (_Var2);
      }
      Curl_cshutdn_setfds((cshutdn *)((long)m + 0x188),*(Curl_easy **)((long)m + 0x78),read_fd_set,
                          write_fd_set,&local_64);
      *local_60 = local_64;
      CVar3 = CURLM_OK;
    }
    else {
      CVar3 = CURLM_RECURSIVE_API_CALL;
    }
  }
  return CVar3;
}

Assistant:

CURLMcode curl_multi_fdset(CURLM *m,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  int this_max_fd = -1;
  struct Curl_multi *multi = m;
  unsigned int i, mid;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  if(Curl_uint_bset_first(&multi->process, &mid)) {
    do {
      struct Curl_easy *data = Curl_multi_get_easy(multi, mid);
      struct easy_pollset ps;

      if(!data) {
        DEBUGASSERT(0);
        continue;
      }

      Curl_multi_getsock(data, &ps, "curl_multi_fdset");
      for(i = 0; i < ps.num; i++) {
        if(!FDSET_SOCK(ps.sockets[i]))
          /* pretend it does not exist */
          continue;
#if defined(__DJGPP__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warith-conversion"
#endif
        if(ps.actions[i] & CURL_POLL_IN)
          FD_SET(ps.sockets[i], read_fd_set);
        if(ps.actions[i] & CURL_POLL_OUT)
          FD_SET(ps.sockets[i], write_fd_set);
#if defined(__DJGPP__)
#pragma GCC diagnostic pop
#endif
        if((int)ps.sockets[i] > this_max_fd)
          this_max_fd = (int)ps.sockets[i];
      }
    }
    while(Curl_uint_bset_next(&multi->process, mid, &mid));
  }

  Curl_cshutdn_setfds(&multi->cshutdn, multi->admin,
                      read_fd_set, write_fd_set, &this_max_fd);

  *max_fd = this_max_fd;

  return CURLM_OK;
}